

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

void __thiscall cmCTestSVN::LogParser::StartElement(LogParser *this,string *name,char **atts)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  bVar2 = std::operator==(name,"logentry");
  if (bVar2) {
    memset(local_120,0,0xf8);
    local_128._M_p = (pointer)0x0;
    local_120._16_8_ = &local_100;
    local_100._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_40._M_local_buf[0] = '\0';
    local_130 = (undefined1  [8])local_120;
    Revision::operator=(&this->Rev,(Revision *)local_130);
    cmCTestVC::Revision::~Revision((Revision *)local_130);
    (this->Rev).SVNInfo = this->SVNRepo;
    pcVar3 = cmXMLParser::FindAttribute(atts,"revision");
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->Rev);
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::clear
              (&this->Changes);
  }
  else {
    bVar2 = std::operator==(name,"path");
    if (bVar2) {
      local_130[0] = 0x3f;
      local_128._M_p = local_120 + 8;
      local_120._0_8_ = 0;
      local_120[8] = '\0';
      cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_130);
      std::__cxx11::string::~string((string *)&local_128);
      pcVar3 = cmXMLParser::FindAttribute(atts,"action");
      if (pcVar3 != (char *)0x0) {
        (this->CurChange).Action = *pcVar3;
      }
    }
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    this->CData.clear();
    if (name == "logentry") {
      this->Rev = Revision();
      this->Rev.SVNInfo = &this->SVNRepo;
      if (const char* rev =
            cmCTestSVN::LogParser::FindAttribute(atts, "revision")) {
        this->Rev.Rev = rev;
      }
      this->Changes.clear();
    } else if (name == "path") {
      this->CurChange = Change();
      if (const char* action =
            cmCTestSVN::LogParser::FindAttribute(atts, "action")) {
        this->CurChange.Action = action[0];
      }
    }
  }